

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall
ON_MappingRef::AddMappingChannel(ON_MappingRef *this,int mapping_channel_id,ON_UUID *mapping_id)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  int iVar3;
  ON_MappingChannel *pOVar4;
  ON_MappingChannel *mc;
  ON_MappingChannel *mc_1;
  int i;
  ON_UUID *mapping_id_local;
  int mapping_channel_id_local;
  ON_MappingRef *this_local;
  
  mc_1._4_4_ = ON_SimpleArray<ON_MappingChannel>::Count(&this->m_mapping_channels);
  if (0 < mc_1._4_4_) {
    mc = ON_SimpleArray<ON_MappingChannel>::Array(&this->m_mapping_channels);
    while (mc_1._4_4_ != 0) {
      if (mapping_channel_id == mc->m_mapping_channel_id) {
        iVar3 = ON_UuidCompare(mapping_id,&mc->m_mapping_id);
        return iVar3 == 0;
      }
      mc = mc + 1;
      mc_1._4_4_ = mc_1._4_4_ + -1;
    }
  }
  pOVar4 = ON_SimpleArray<ON_MappingChannel>::AppendNew(&this->m_mapping_channels);
  pOVar4->m_mapping_channel_id = mapping_channel_id;
  uVar1 = mapping_id->Data2;
  uVar2 = mapping_id->Data3;
  (pOVar4->m_mapping_id).Data1 = mapping_id->Data1;
  (pOVar4->m_mapping_id).Data2 = uVar1;
  (pOVar4->m_mapping_id).Data3 = uVar2;
  *(undefined8 *)(pOVar4->m_mapping_id).Data4 = *(undefined8 *)mapping_id->Data4;
  pOVar4->m_mapping_index = -1;
  memcpy(&pOVar4->m_object_xform,&ON_Xform::IdentityTransformation,0x80);
  return true;
}

Assistant:

bool ON_MappingRef::AddMappingChannel(
        int mapping_channel_id,
        const ON_UUID& mapping_id
        )
{
  int i;
  if ( (i = m_mapping_channels.Count()) > 0 )
  {
    for ( const ON_MappingChannel* mc = m_mapping_channels.Array(); i--; mc++ )
    {
      if ( mapping_channel_id == mc->m_mapping_channel_id )
      {
        // a matching mapping channel id exists
        // return true if mapping_id matches
        return ( 0 == ON_UuidCompare(&mapping_id,&mc->m_mapping_id) );
      }
    }
  }

  ON_MappingChannel& mc   = m_mapping_channels.AppendNew();
  mc.m_mapping_channel_id = mapping_channel_id;
  mc.m_mapping_id         = mapping_id;
  mc.m_mapping_index      = -1; // 27th October 2011 John Croudy - constructor is not called by AppendNew().
  mc.m_object_xform = ON_Xform::IdentityTransformation;

  return true;
}